

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool ON_3dmSettings_Read_v1_TCODE_NAME(ON_BinaryArchive *file,ON_wString *str)

{
  bool bVar1;
  uint in_EAX;
  char *p;
  uint uStack_28;
  int len;
  
  uStack_28 = in_EAX;
  ON_wString::Empty(str);
  _uStack_28 = (ulong)uStack_28;
  bVar1 = ON_BinaryArchive::ReadInt(file,&len);
  if (0 < len && bVar1) {
    p = (char *)oncalloc(1,(ulong)(uint)len + 1);
    bVar1 = ON_BinaryArchive::ReadString(file,(long)len,p);
    if (bVar1) {
      ON_wString::operator=(str,p);
    }
    if (p != (char *)0x0) {
      onfree(p);
    }
  }
  return bVar1;
}

Assistant:

static bool ON_3dmSettings_Read_v1_TCODE_NAME(ON_BinaryArchive& file, ON_wString& str )
{
  // reads legacy 1.0 named view TCODE_NAME chunk
  str.Empty();
  int len = 0;
  bool rc = file.ReadInt( &len );
  if (rc && len > 0) {
    char* name = (char*)oncalloc( 1, len + 1);
    rc = file.ReadString( len, name );
    if (rc)
      str = name; // ASCII -> UNICODE
    if (name)
      onfree(name);
  }
  return rc;
}